

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

char * __thiscall cmsys::CommandLineArguments::GetHelp(CommandLineArguments *this,char *arg)

{
  Internal *pIVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_98;
  String local_90;
  _Self local_70;
  iterator hit;
  CommandLineArgumentsCallbackStructure *cs;
  String local_48;
  _Self local_28;
  iterator it;
  char *arg_local;
  CommandLineArguments *this_local;
  
  pIVar1 = this->Internals;
  it._M_node = (_Base_ptr)arg;
  String::String(&local_48,arg);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ::find(&(pIVar1->Callbacks).
               super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ,&local_48);
  String::~String(&local_48);
  cs = (CommandLineArgumentsCallbackStructure *)
       std::
       map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ::end(&(this->Internals->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
            );
  bVar2 = std::operator==(&local_28,(_Self *)&cs);
  if (bVar2) {
    this_local = (CommandLineArguments *)0x0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
             ::operator->(&local_28);
    while( true ) {
      hit._M_node = (_Base_ptr)&ppVar3->second;
      pIVar1 = this->Internals;
      String::String(&local_90,(ppVar3->second).Help);
      local_70._M_node =
           (_Base_ptr)
           std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::find(&(pIVar1->Callbacks).
                   super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                  ,&local_90);
      String::~String(&local_90);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::end(&(this->Internals->Callbacks).
                  super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                );
      bVar2 = std::operator==(&local_70,&local_98);
      if (bVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->(&local_70);
    }
    this_local = (CommandLineArguments *)hit._M_node[1]._M_left;
  }
  return (char *)this_local;
}

Assistant:

const char* CommandLineArguments::GetHelp(const char* arg)
{
  CommandLineArguments::Internal::CallbacksMap::iterator it 
    = this->Internals->Callbacks.find(arg);
  if ( it == this->Internals->Callbacks.end() )
    {
    return 0;
    }

  // Since several arguments may point to the same argument, find the one this
  // one point to if this one is pointing to another argument.
  CommandLineArgumentsCallbackStructure *cs = &(it->second);
  for(;;)
    {
    CommandLineArguments::Internal::CallbacksMap::iterator hit 
      = this->Internals->Callbacks.find(cs->Help);
    if ( hit == this->Internals->Callbacks.end() )
      {
      break;
      }
    cs = &(hit->second);
    }
  return cs->Help;
}